

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_4.h
# Opt level: O0

void __thiscall PlayerMike_4::~PlayerMike_4(PlayerMike_4 *this)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  *in_RDI = &PTR__PlayerMike_4_0011bc00;
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  Player::~Player((Player *)0x109c84);
  return;
}

Assistant:

PlayerMike_4(const std::string& name) :
      Player(name),
      m_predict(27*9)
   {}